

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

void rnd_well_seed(rnd_well_t *well,uint seed)

{
  uint uVar1;
  int local_1c;
  int i;
  uint value;
  uint seed_local;
  rnd_well_t *well_local;
  
  uVar1 = rnd_internal_murmur3_avalanche32(seed << 1 | 1);
  well->state[0x10] = 0;
  well->state[0] = uVar1 ^ 0xf68a9fc1;
  for (local_1c = 1; local_1c < 0x10; local_1c = local_1c + 1) {
    well->state[local_1c] =
         (well->state[local_1c + -1] ^ well->state[local_1c + -1] >> 0x1e) * 0x6c078965 + local_1c;
  }
  return;
}

Assistant:

void rnd_well_seed( rnd_well_t* well, RND_U32 seed )
    {
    RND_U32 value = rnd_internal_murmur3_avalanche32( ( seed << 1U ) | 1U );
    well->state[ 16 ] = 0;
    well->state[ 0 ] = value ^ 0xf68a9fc1U;
    for( int i = 1; i < 16; ++i ) 
        well->state[ i ] = ( 0x6c078965U * ( well->state[ i - 1 ] ^ ( well->state[ i - 1 ] >> 30 ) ) + i ); 
    }